

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *data;
  double *pdVar2;
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> r;
  vector<double,_std::allocator<double>_> x;
  PolyFit<double> f;
  vector<double,_std::allocator<double>_> local_aa8;
  vector<double,_std::allocator<double>_> local_a90;
  vector<double,_std::allocator<double>_> local_a78;
  Options local_a58;
  PolyFit<double> local_a40;
  
  logger.minLevel = ERROR;
  local_a78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_aa8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_aa8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_aa8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  IO::readData<double>((IO *)argv[1],(char *)&local_a78,in_RDX);
  IO::readData<double>((IO *)argv[2],(char *)&local_aa8,data);
  local_a58.solver = EIGEN_JACOBI_SVD;
  local_a58.polyDeg = 3;
  local_a58.maxTrial = 500;
  local_a58.maxMPts = 10;
  local_a58.tolerance = 0.001;
  PolyFit<double>::PolyFit(&local_a40,&local_a78,&local_aa8,&local_a58);
  PolyFit<double>::solveRLS(&local_a40);
  PolyFit<double>::evalPoly(&local_a90,&local_a40,&local_a78);
  pdVar2 = local_a90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_a90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_a90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      poVar1 = std::ostream::_M_insert<double>(*pdVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != local_a90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_a90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_a90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_a40.V.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      );
  free(local_a40.yM.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free(local_a40.xM.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
  ;
  free(local_a40.pCoef.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  if (local_aa8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_aa8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_aa8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_aa8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) 
{
  // Sets the log level to DEBUG
  logger.setLevel(ERROR);

  try 
  {
    // Create (sample, signal) vectors
    std::vector<double> x,y;

    // Read in (sample, signal) = (x,y) values
    IO::readData<double>(argv[1],x);
    IO::readData<double>(argv[2],y);

    // Create options for fitting
    PolyFit<double>::Options options;

    options.polyDeg = 3; // 3-rd degree polynomial
    options.solver = PolyFit<double>::EIGEN_JACOBI_SVD; // SVD solver
    options.maxMPts = 10; // #Pts to use for fitting
    options.maxTrial = 500; // Max. nr. of trials
    options.tolerance = 0.001; // Distance tolerance for inlier

    // Create fitting object
    PolyFit<double>f(x,y,options);

    // Solve using RANSAC 
    f.solveRLS();

    // Output result
    //cout << f << endl;
    
    std::vector<double> r = f.evalPoly(x);
    std::vector<double>::iterator it = r.begin();
    while (it != r.end())
    {
      std::cout << *it << std::endl;
      ++it;
    }
  



  }
  catch (exception &e)
  {
    logger.log(ERROR, "[%s]: Exiting ...\n",
        __func__);
    exit(EXIT_FAILURE);
  }
  return 0;

}